

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ReduceL2LayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducel2(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4e7) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4e7;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReduceL2LayerParams::ReduceL2LayerParams(this_00.reducel2_);
    (this->layer_).reducel2_ = (ReduceL2LayerParams *)this_00;
  }
  return (ReduceL2LayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceL2LayerParams* NeuralNetworkLayer::mutable_reducel2() {
  if (!has_reducel2()) {
    clear_layer();
    set_has_reducel2();
    layer_.reducel2_ = new ::CoreML::Specification::ReduceL2LayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceL2)
  return layer_.reducel2_;
}